

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O0

size_t __thiscall TcpSocketImpl::PutBackRead(TcpSocketImpl *this,void *buf,size_t len)

{
  __array __n;
  type __result;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> local_30;
  __array tmp;
  size_t len_local;
  void *buf_local;
  TcpSocketImpl *this_local;
  
  if ((buf == (void *)0x0) || (len == 0)) {
    this_local = (TcpSocketImpl *)0x0;
  }
  else {
    tmp._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
         (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)len;
    std::make_unique<unsigned_char[]>((size_t)&local_30);
    __n._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         tmp._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    __result = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                         (&local_30,0);
    std::copy_n<unsigned_char_const*,unsigned_long,unsigned_char*>
              ((uchar *)buf,
               (unsigned_long)
               __n._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
               _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
               super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,__result);
    std::mutex::lock(&this->m_mxInDeque);
    std::
    deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
    ::
    emplace_front<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long&>
              ((deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
                *)&this->m_quInData,&local_30,(unsigned_long *)&tmp);
    std::__atomic_base<unsigned_long>::operator+=
              (&(this->m_atInBytes).super___atomic_base<unsigned_long>,
               (__int_type)
               tmp._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
               _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
               super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
    std::mutex::unlock(&this->m_mxInDeque);
    this_local = (TcpSocketImpl *)
                 tmp._M_t.
                 super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                 super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(&local_30);
  }
  return (size_t)this_local;
}

Assistant:

size_t TcpSocketImpl::PutBackRead(void* buf, size_t len)
{
    if (buf == nullptr || len == 0)
        return 0;

    auto tmp = make_unique<uint8_t[]>(len);
    copy_n(&static_cast<const uint8_t*>(buf)[0], len, &tmp[0]);
    m_mxInDeque.lock();
    m_quInData.emplace_front(move(tmp), len);
    m_atInBytes += len;
    m_mxInDeque.unlock();

    return len;
}